

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkPipelineRasterizationStateCreateInfo *
Diligent::RasterizerStateDesc_To_VkRasterizationStateCI
          (VkPipelineRasterizationStateCreateInfo *__return_storage_ptr__,
          RasterizerStateDesc *RasterizerDesc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  VkPolygonMode VVar4;
  VkCullModeFlagBits VVar5;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->depthClampEnable = 0;
  __return_storage_ptr__->rasterizerDiscardEnable = 0;
  __return_storage_ptr__->polygonMode = VK_POLYGON_MODE_FILL;
  __return_storage_ptr__->depthBiasClamp = 0.0;
  __return_storage_ptr__->depthBiasSlopeFactor = 0.0;
  *(undefined8 *)&__return_storage_ptr__->lineWidth = 0;
  __return_storage_ptr__->cullMode = 0;
  __return_storage_ptr__->frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  __return_storage_ptr__->depthBiasEnable = 0;
  __return_storage_ptr__->depthBiasConstantFactor = 0.0;
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->depthClampEnable = RasterizerDesc->DepthClipEnable ^ 1;
  VVar4 = FillModeToVkPolygonMode(RasterizerDesc->FillMode);
  __return_storage_ptr__->polygonMode = VVar4;
  VVar5 = CullModeToVkCullMode(RasterizerDesc->CullMode);
  __return_storage_ptr__->cullMode = VVar5;
  __return_storage_ptr__->frontFace =
       RasterizerDesc->FrontCounterClockwise ^ VK_FRONT_FACE_CLOCKWISE;
  iVar3 = RasterizerDesc->DepthBias;
  __return_storage_ptr__->depthBiasConstantFactor = (float)iVar3;
  uVar1 = RasterizerDesc->DepthBiasClamp;
  uVar2 = RasterizerDesc->SlopeScaledDepthBias;
  __return_storage_ptr__->depthBiasEnable = (uint)((float)uVar2 != 0.0 || iVar3 != 0);
  __return_storage_ptr__->depthBiasClamp = (float)uVar1;
  __return_storage_ptr__->depthBiasSlopeFactor = (float)uVar2;
  __return_storage_ptr__->lineWidth = 1.0;
  return __return_storage_ptr__;
}

Assistant:

VkPipelineRasterizationStateCreateInfo RasterizerStateDesc_To_VkRasterizationStateCI(const RasterizerStateDesc& RasterizerDesc)
{
    VkPipelineRasterizationStateCreateInfo RSStateCI = {};

    RSStateCI.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
    RSStateCI.pNext = nullptr;
    RSStateCI.flags = 0; // Reserved for future use.

    // If depth clamping is enabled, before the incoming fragment's zf is compared to za, zf is clamped to
    // [min(n,f), max(n,f)], where n and f are the minDepth and maxDepth depth range values of the viewport
    // used by this fragment, respectively
    // This value is the opposite of clip enable
    RSStateCI.depthClampEnable = RasterizerDesc.DepthClipEnable ? VK_FALSE : VK_TRUE;

    RSStateCI.rasterizerDiscardEnable = VK_FALSE; // Whether primitives are discarded immediately before the rasterization stage.
    RSStateCI.polygonMode             = FillModeToVkPolygonMode(RasterizerDesc.FillMode);
    RSStateCI.cullMode                = CullModeToVkCullMode(RasterizerDesc.CullMode);
    RSStateCI.frontFace               = RasterizerDesc.FrontCounterClockwise ? VK_FRONT_FACE_COUNTER_CLOCKWISE : VK_FRONT_FACE_CLOCKWISE;
    // Depth bias (24.7.3)
    RSStateCI.depthBiasEnable = (RasterizerDesc.DepthBias != 0 || RasterizerDesc.SlopeScaledDepthBias != 0.f) ? VK_TRUE : VK_FALSE;
    RSStateCI.depthBiasConstantFactor =
        static_cast<float>(RasterizerDesc.DepthBias);         // a scalar factor applied to an implementation-dependent constant
                                                              // that relates to the usable resolution of the depth buffer
    RSStateCI.depthBiasClamp = RasterizerDesc.DepthBiasClamp; // maximum (or minimum) depth bias of a fragment.
    RSStateCI.depthBiasSlopeFactor =
        RasterizerDesc.SlopeScaledDepthBias; //  a scalar factor applied to a fragment's slope in depth bias calculations.
    RSStateCI.lineWidth = 1.f;               // If the wide lines feature is not enabled, and no element of the pDynamicStates member of
                                             // pDynamicState is VK_DYNAMIC_STATE_LINE_WIDTH, the lineWidth member of
                                             // pRasterizationState must be 1.0

    return RSStateCI;
}